

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createGeometryGridRenderLimitsTests(TestContext *testCtx)

{
  GridRenderTestCase *this;
  long lVar1;
  allocator<char> local_82;
  allocator<char> local_81;
  TestNode *local_80;
  TestContext *local_78;
  string local_70;
  string local_50;
  
  local_80 = (TestNode *)operator_new(0x70);
  local_78 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_80,testCtx,"limits","Render with properties near their limits");
  lVar1 = 0x10;
  do {
    this = (GridRenderTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&PTR_typeinfo_00d64d70 + lVar1),&local_81);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)(&UNK_00d64d78 + lVar1),&local_82);
    anon_unknown_1::GridRenderTestCase::GridRenderTestCase
              (this,local_78,&local_50,&local_70,
               *(Flags *)((long)&createGeometryGridRenderLimitsTests::cases[0].name + lVar1));
    tcu::TestNode::addChild(local_80,(TestNode *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x58);
  return (TestCaseGroup *)local_80;
}

Assistant:

tcu::TestCaseGroup* createGeometryGridRenderLimitsTests  (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "limits", "Render with properties near their limits"));

	static const TestCaseDescription cases[] =
	{
		{
			"output_required_max_tessellation",
			"Minimum maximum tessellation level",
			FLAG_TESSELLATION_MAX_SPEC
		},
		{
			"output_required_max_geometry",
			"Output minimum maximum number of vertices the geometry shader",
			FLAG_GEOMETRY_MAX_SPEC
		},
		{
			"output_required_max_invocations",
			"Minimum maximum number of geometry shader invocations",
			FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ++ndx)
		group->addChild(new GridRenderTestCase(testCtx, cases[ndx].name, cases[ndx].desc, cases[ndx].flags));

	return group.release();
}